

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O2

void bcwrite_proto(BCWriteCtx *ctx,GCproto *pt)

{
  double dVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  uint *puVar9;
  MSize MVar10;
  MSize sz;
  GCproto *pt_00;
  uint uVar11;
  ulong uVar12;
  MSize i;
  uint32_t uVar13;
  ulong uVar14;
  cTValue *pcVar15;
  int iVar16;
  uint local_4c;
  
  if ((pt->flags & 1) != 0) {
    uVar8 = (pt->k).ptr32;
    uVar11 = pt->sizekgc;
    for (lVar7 = 0; -lVar7 != (ulong)uVar11; lVar7 = lVar7 + -1) {
      pt_00 = (GCproto *)(ulong)*(uint *)(((ulong)uVar8 - 4) + lVar7 * 4);
      if (pt_00->gct == '\a') {
        bcwrite_proto(ctx,pt_00);
      }
    }
  }
  MVar10 = (uint)pt->sizeuv * 2 + pt->sizebc * 4 + 0x23;
  uVar8 = (ctx->sb).b.ptr32;
  pcVar6 = (char *)(ulong)uVar8;
  if ((ctx->sb).e.ptr32 - uVar8 < MVar10) {
    pcVar6 = lj_buf_need2(&ctx->sb,MVar10);
  }
  pcVar6[5] = pt->flags & 7;
  pcVar6[6] = pt->numparams;
  pcVar6[7] = pt->framesize;
  pcVar6[8] = pt->sizeuv;
  pcVar6 = lj_strfmt_wuleb128(pcVar6 + 9,pt->sizekgc);
  pcVar6 = lj_strfmt_wuleb128(pcVar6,pt->sizekn);
  pcVar6 = lj_strfmt_wuleb128(pcVar6,pt->sizebc - 1);
  if (ctx->strip == 0) {
    uVar13 = (pt->lineinfo).ptr32;
    local_4c = 0;
    if (uVar13 != 0) {
      local_4c = ((int)pt - uVar13) + pt->sizept;
    }
    pcVar6 = lj_strfmt_wuleb128(pcVar6,local_4c);
    if (local_4c != 0) {
      pcVar6 = lj_strfmt_wuleb128(pcVar6,pt->firstline);
      pcVar6 = lj_strfmt_wuleb128(pcVar6,pt->numline);
      goto LAB_00120b03;
    }
  }
  local_4c = 0;
LAB_00120b03:
  MVar10 = pt->sizebc;
  uVar12 = (ulong)(MVar10 * 4 - 4);
  memcpy(pcVar6,&pt[1].marked,uVar12);
  if (((pt->flags & 0x10) != 0) || (pt->trace != 0)) {
    uVar8 = *(uint *)((ulong)(ctx->sb).L.ptr32 + 8);
    for (lVar7 = 0; MVar10 - 1 != (int)lVar7; lVar7 = lVar7 + 1) {
      uVar11 = (byte)pcVar6[lVar7 * 4] - 0x4e;
      if (uVar11 < 10) {
        if ((0x125U >> (uVar11 & 0x1f) & 1) == 0) {
          if ((0x248U >> (uVar11 & 0x1f) & 1) != 0) {
            *(undefined4 *)(pcVar6 + lVar7 * 4) =
                 *(undefined4 *)
                  ((ulong)*(uint *)(*(long *)((ulong)uVar8 + 0x3b8) +
                                   (ulong)*(ushort *)(pcVar6 + lVar7 * 4 + 2) * 4) + 0x38);
          }
        }
        else {
          pcVar6[lVar7 * 4] = pcVar6[lVar7 * 4] - 1;
        }
      }
    }
  }
  bVar2 = pt->sizeuv;
  memcpy(pcVar6 + uVar12,(void *)(ulong)(pt->uv).ptr32,(ulong)((uint)bVar2 + (uint)bVar2));
  (ctx->sb).p.ptr32 = (int)(pcVar6 + uVar12) + (uint)bVar2 * 2;
  uVar8 = pt->sizekgc;
  puVar9 = (uint *)((ulong)(pt->k).ptr32 + (ulong)uVar8 * -4);
  uVar11 = 0;
  do {
    if (uVar11 == uVar8) {
      uVar12 = (ulong)(pt->k).ptr32;
      MVar10 = pt->sizekn;
      sz = MVar10 * 10;
      uVar8 = (ctx->sb).p.ptr32;
      pcVar6 = (char *)(ulong)uVar8;
      if ((ctx->sb).e.ptr32 - uVar8 < sz) {
        pcVar6 = lj_buf_more2(&ctx->sb,sz);
      }
      for (lVar7 = 0; MVar10 != (MSize)lVar7; lVar7 = lVar7 + 1) {
        dVar1 = *(double *)(uVar12 + lVar7 * 8);
        if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
          pcVar6 = lj_strfmt_wuleb128(pcVar6,(SUB84(dVar1,0) & 0x80000000 | SUB84(dVar1,0) * 2) + 1)
          ;
          iVar16 = *(int *)(uVar12 + lVar7 * 8);
          if (iVar16 < 0) {
            pcVar6[-1] = (byte)((uint)iVar16 >> 0x1b) & 0x18 | pcVar6[-1] & 7U;
          }
          pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar12 + 4 + lVar7 * 8));
        }
        else {
          uVar8 = (uint)dVar1;
          pcVar6 = lj_strfmt_wuleb128(pcVar6,uVar8 & 0x80000000 | uVar8 * 2);
          if ((int)uVar8 < 0) {
            pcVar6[-1] = (byte)(uVar8 >> 0x1b) & 0x18 | pcVar6[-1] & 7U;
          }
        }
      }
      (ctx->sb).p.ptr32 = (uint32_t)pcVar6;
      if (local_4c != 0) {
        if ((ctx->sb).e.ptr32 - (uint32_t)pcVar6 < local_4c) {
          pcVar6 = lj_buf_more2(&ctx->sb,local_4c);
        }
        else {
          pcVar6 = (char *)((ulong)pcVar6 & 0xffffffff);
        }
        memcpy(pcVar6,(void *)(ulong)(pt->lineinfo).ptr32,(ulong)local_4c);
        uVar8 = (int)pcVar6 + local_4c;
        pcVar6 = (char *)(ulong)uVar8;
        (ctx->sb).p.ptr32 = uVar8;
      }
      if (ctx->status == 0) {
        uVar11 = (ctx->sb).b.ptr32;
        iVar16 = (int)pcVar6 - uVar11;
        uVar8 = iVar16 - 5;
        uVar4 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        pcVar6 = (char *)((ulong)(5 - ((uVar4 ^ 0xffffffe0) * 9 + 0x168 >> 6)) + (ulong)uVar11);
        lj_strfmt_wuleb128(pcVar6,uVar8);
        iVar16 = (*ctx->wfunc)((lua_State *)(ctx->sb).L.ptr32,pcVar6,(long)iVar16 + 0xfffffffb,
                               ctx->wdata);
        ctx->status = iVar16;
      }
      return;
    }
    uVar12 = (ulong)*puVar9;
    cVar3 = *(char *)(uVar12 + 5);
    if (cVar3 == '\n') {
      uVar13 = 2;
      MVar10 = 0x15;
      if (*(short *)(uVar12 + 6) != 0xb) {
        if (*(short *)(uVar12 + 6) == 0xc) {
          uVar13 = 3;
        }
        else {
          uVar13 = 4;
        }
      }
    }
    else if (cVar3 == '\a') {
      uVar13 = 0;
      MVar10 = 1;
    }
    else if (cVar3 == '\x04') {
      MVar10 = *(int *)(uVar12 + 0xc) + 5;
      uVar13 = MVar10;
    }
    else {
      MVar10 = 0xb;
      uVar13 = 1;
    }
    uVar4 = (ctx->sb).p.ptr32;
    pcVar6 = (char *)(ulong)uVar4;
    if ((ctx->sb).e.ptr32 - uVar4 < MVar10) {
      pcVar6 = lj_buf_more2(&ctx->sb,MVar10);
    }
    pcVar6 = lj_strfmt_wuleb128(pcVar6,uVar13);
    if (uVar13 < 5) {
      if (uVar13 == 0) goto LAB_00120cf3;
      if (uVar13 != 1) {
        pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar12 + 8));
        pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar12 + 0xc));
        if (uVar13 == 4) {
          pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar12 + 0x10));
          pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar12 + 0x14));
        }
        goto LAB_00120cf3;
      }
      uVar13 = 0;
      uVar14 = 0;
      if ((ulong)*(uint *)(uVar12 + 0x18) != 0) {
        uVar5 = (ulong)*(uint *)(uVar12 + 0x18);
        do {
          uVar14 = uVar5;
          if ((long)uVar14 < 1) {
            uVar14 = 0;
            break;
          }
          uVar5 = uVar14 - 1;
        } while (*(int *)(((ulong)*(uint *)(uVar12 + 8) - 4) + uVar14 * 8) == -1);
      }
      if (*(int *)(uVar12 + 0x1c) != 0) {
        uVar13 = 0;
        for (lVar7 = 0; (ulong)(*(int *)(uVar12 + 0x1c) + 1) * 0x18 - lVar7 != 0;
            lVar7 = lVar7 + 0x18) {
          uVar13 = uVar13 + (*(int *)((ulong)*(uint *)(uVar12 + 0x14) + 4 + lVar7) != -1);
        }
      }
      pcVar6 = lj_strfmt_wuleb128(pcVar6,(uint32_t)uVar14);
      pcVar6 = lj_strfmt_wuleb128(pcVar6,uVar13);
      (ctx->sb).p.ptr32 = (uint32_t)pcVar6;
      if ((uint32_t)uVar14 != 0) {
        pcVar15 = (cTValue *)(ulong)*(uint *)(uVar12 + 8);
        while (iVar16 = (int)uVar14, uVar14 = (ulong)(iVar16 - 1), iVar16 != 0) {
          bcwrite_ktabk(ctx,pcVar15,1);
          pcVar15 = pcVar15 + 1;
        }
      }
      if (uVar13 != 0) {
        pcVar15 = (cTValue *)
                  ((ulong)*(uint *)(uVar12 + 0x14) + (ulong)*(uint *)(uVar12 + 0x1c) * 0x18 + 8);
        do {
          if (*(int *)((long)pcVar15 + -4) != -1) {
            bcwrite_ktabk(ctx,pcVar15,0);
            bcwrite_ktabk(ctx,pcVar15 + -1,1);
            uVar13 = uVar13 - 1;
            if (uVar13 == 0) break;
          }
          pcVar15 = pcVar15 + -3;
        } while( true );
      }
    }
    else {
      uVar4 = *(uint *)(uVar12 + 0xc);
      memcpy(pcVar6,(void *)(uVar12 + 0x10),(ulong)uVar4);
      pcVar6 = pcVar6 + uVar4;
LAB_00120cf3:
      (ctx->sb).p.ptr32 = (uint32_t)pcVar6;
    }
    uVar11 = uVar11 + 1;
    puVar9 = puVar9 + 1;
  } while( true );
}

Assistant:

static void bcwrite_proto(BCWriteCtx *ctx, GCproto *pt)
{
  MSize sizedbg = 0;
  char *p;

  /* Recursively write children of prototype. */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO)
	bcwrite_proto(ctx, gco2pt(o));
    }
  }

  /* Start writing the prototype info to a buffer. */
  p = lj_buf_need(&ctx->sb,
		  5+4+6*5+(pt->sizebc-1)*(MSize)sizeof(BCIns)+pt->sizeuv*2);
  p += 5;  /* Leave room for final size. */

  /* Write prototype header. */
  *p++ = (pt->flags & (PROTO_CHILD|PROTO_VARARG|PROTO_FFI));
  *p++ = pt->numparams;
  *p++ = pt->framesize;
  *p++ = pt->sizeuv;
  p = lj_strfmt_wuleb128(p, pt->sizekgc);
  p = lj_strfmt_wuleb128(p, pt->sizekn);
  p = lj_strfmt_wuleb128(p, pt->sizebc-1);
  if (!ctx->strip) {
    if (proto_lineinfo(pt))
      sizedbg = pt->sizept - (MSize)((char *)proto_lineinfo(pt) - (char *)pt);
    p = lj_strfmt_wuleb128(p, sizedbg);
    if (sizedbg) {
      p = lj_strfmt_wuleb128(p, pt->firstline);
      p = lj_strfmt_wuleb128(p, pt->numline);
    }
  }

  /* Write bytecode instructions and upvalue refs. */
  p = bcwrite_bytecode(ctx, p, pt);
  p = lj_buf_wmem(p, proto_uv(pt), pt->sizeuv*2);
  setsbufP(&ctx->sb, p);

  /* Write constants. */
  bcwrite_kgc(ctx, pt);
  bcwrite_knum(ctx, pt);

  /* Write debug info, if not stripped. */
  if (sizedbg) {
    p = lj_buf_more(&ctx->sb, sizedbg);
    p = lj_buf_wmem(p, proto_lineinfo(pt), sizedbg);
    setsbufP(&ctx->sb, p);
  }

  /* Pass buffer to writer function. */
  if (ctx->status == 0) {
    MSize n = sbuflen(&ctx->sb) - 5;
    MSize nn = (lj_fls(n)+8)*9 >> 6;
    char *q = sbufB(&ctx->sb) + (5 - nn);
    p = lj_strfmt_wuleb128(q, n);  /* Fill in final size. */
    lj_assertBCW(p == sbufB(&ctx->sb) + 5, "bad ULEB128 write");
    ctx->status = ctx->wfunc(sbufL(&ctx->sb), q, nn+n, ctx->wdata);
  }
}